

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall leveldb::StringSink::~StringSink(StringSink *this)

{
  pointer pcVar1;
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__StringSink_0017e3d0;
  pcVar1 = (this->contents_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->contents_).field_2) {
    operator_delete(pcVar1);
  }
  WritableFile::~WritableFile(&this->super_WritableFile);
  return;
}

Assistant:

~StringSink() override = default;